

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O3

char * MyGame_Example_Test_parse_json_struct_inline
                 (flatcc_json_parser_t *ctx,char *buf,char *end,void *struct_base)

{
  byte bVar1;
  size_t n;
  ulong uVar2;
  char *pcVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  byte *pbVar7;
  ulong uVar8;
  byte *pbVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  byte *pbVar13;
  uint64_t value;
  ushort local_46;
  int local_44;
  uint64_t local_40;
  int local_34;
  
  if ((buf == end) || (*buf != '{')) {
    pcVar3 = flatcc_json_parser_set_error(ctx,buf,end,0x15);
    return pcVar3;
  }
  pbVar7 = (byte *)(buf + 1);
  if ((long)end - (long)pbVar7 < 2) {
LAB_0011033e:
    pbVar7 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar7,end);
  }
  else if ((char)*pbVar7 < '!') {
    if ((*pbVar7 != 0x20) || (buf[2] < '!')) goto LAB_0011033e;
    pbVar7 = (byte *)(buf + 2);
  }
  if ((pbVar7 == (byte *)end) || (*pbVar7 != 0x7d)) {
    local_34 = 1;
    pbVar13 = pbVar7;
    do {
      if (pbVar13 != (byte *)end) {
        if (*pbVar13 == 0x2e) {
          pbVar13 = (byte *)flatcc_json_parser_set_error(ctx,(char *)pbVar13,end,5);
        }
        else if (*pbVar13 == 0x22) {
          pbVar13 = pbVar13 + 1;
          ctx->unquoted = 0;
        }
        else {
          ctx->unquoted = 1;
        }
      }
      uVar2 = (long)end - (long)pbVar13;
      pbVar7 = pbVar13;
      if (uVar2 < 8) {
        uVar6 = 0;
        uVar5 = 0;
        uVar8 = 0;
        uVar10 = 0;
        uVar11 = 0;
        uVar12 = 0;
        switch(uVar2) {
        case 7:
          uVar6 = (long)(char)pbVar13[6] << 8;
        case 6:
          uVar5 = (long)(char)pbVar13[5] << 0x10 | uVar6;
        case 5:
          uVar8 = (long)(char)pbVar13[4] << 0x18 | uVar5;
        case 4:
          uVar10 = (long)(char)pbVar13[3] << 0x20 | uVar8;
        case 3:
          uVar11 = (long)(char)pbVar13[2] << 0x28 | uVar10;
        case 2:
          uVar12 = (long)(char)pbVar13[1] << 0x30 | uVar11;
        case 1:
          uVar12 = (ulong)*pbVar13 << 0x38 | uVar12;
          goto LAB_00110461;
        }
switchD_0011040d_default:
        pbVar13 = (byte *)flatcc_json_parser_unmatched_symbol(ctx,(char *)pbVar7,end);
      }
      else {
        uVar12 = *(long *)pbVar13 << 0x38;
LAB_00110461:
        if ((uVar12 & 0xff00000000000000) != 0x6100000000000000) {
          if ((uVar12 & 0xff00000000000000) == 0x6200000000000000) {
            if (1 < (long)uVar2) {
              bVar1 = pbVar13[1];
              if (ctx->unquoted == 0) {
                if (bVar1 == 0x22) {
                  pbVar9 = pbVar13 + 2;
                  goto LAB_0011051c;
                }
              }
              else if ((char)bVar1 < '!' || bVar1 == 0x3a) {
                pbVar9 = pbVar13 + 1;
                ctx->unquoted = 0;
LAB_0011051c:
                if ((long)end - (long)pbVar9 < 2) {
LAB_00110567:
                  pbVar9 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar9,end);
                }
                else if ((char)*pbVar9 < '!') {
                  if ((*pbVar9 != 0x20) || ((char)pbVar9[1] < '!')) goto LAB_00110567;
                  pbVar9 = pbVar9 + 1;
                }
                if ((pbVar9 == (byte *)end) || (*pbVar9 != 0x3a)) {
                  pbVar7 = (byte *)flatcc_json_parser_set_error(ctx,(char *)pbVar9,end,4);
                }
                else {
                  pbVar7 = pbVar9 + 1;
                  if ((long)end - (long)pbVar7 < 2) {
LAB_00110632:
                    pbVar7 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar7,end);
                  }
                  else if ((char)*pbVar7 < '!') {
                    if ((*pbVar7 != 0x20) || ((char)pbVar9[2] < '!')) goto LAB_00110632;
                    pbVar7 = pbVar9 + 2;
                  }
                }
              }
            }
            if (pbVar13 != pbVar7) {
              local_40 = 0;
              local_44 = 0;
              local_46 = local_46 & 0xff00;
              pbVar13 = pbVar7;
              if ((pbVar7 != (byte *)end) &&
                 (pbVar13 = (byte *)flatcc_json_parser_integer
                                              (ctx,(char *)pbVar7,end,&local_44,&local_40),
                 pbVar13 != pbVar7)) {
                if (local_44 == 0) {
                  uVar2 = local_40;
                  if (local_40 < 0x80) goto LAB_001106cd;
                  iVar4 = 7;
                }
                else {
                  if (local_40 < 0x81) {
                    uVar2 = -local_40;
LAB_001106cd:
                    local_46 = CONCAT11(local_46._1_1_,(char)uVar2);
                    goto LAB_001106d1;
                  }
                  iVar4 = 8;
                }
                pbVar13 = (byte *)flatcc_json_parser_set_error(ctx,(char *)pbVar13,end,iVar4);
              }
LAB_001106d1:
              if ((pbVar7 == pbVar13) &&
                 ((pbVar13 = (byte *)flatcc_json_parser_symbolic_int8
                                               (ctx,(char *)pbVar13,end,
                                                MyGame_Example_Test_parse_json_struct_inline::
                                                symbolic_parsers,(int8_t *)&local_46),
                  pbVar13 == pbVar7 || (pbVar13 == (byte *)end)))) goto LAB_00110820;
              *(undefined1 *)((long)struct_base + 2) = (undefined1)local_46;
              goto LAB_001107ef;
            }
          }
          goto switchD_0011040d_default;
        }
        if (1 < (long)uVar2) {
          bVar1 = pbVar13[1];
          if (ctx->unquoted == 0) {
            if (bVar1 == 0x22) {
              pbVar9 = pbVar13 + 2;
              goto LAB_00110549;
            }
          }
          else if ((char)bVar1 < '!' || bVar1 == 0x3a) {
            pbVar9 = pbVar13 + 1;
            ctx->unquoted = 0;
LAB_00110549:
            if ((long)end - (long)pbVar9 < 2) {
LAB_001105cb:
              pbVar9 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar9,end);
            }
            else if ((char)*pbVar9 < '!') {
              if ((*pbVar9 != 0x20) || ((char)pbVar9[1] < '!')) goto LAB_001105cb;
              pbVar9 = pbVar9 + 1;
            }
            if ((pbVar9 == (byte *)end) || (*pbVar9 != 0x3a)) {
              pbVar7 = (byte *)flatcc_json_parser_set_error(ctx,(char *)pbVar9,end,4);
            }
            else {
              pbVar7 = pbVar9 + 1;
              if ((long)end - (long)pbVar7 < 2) {
LAB_0011070f:
                pbVar7 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar7,end);
              }
              else if ((char)*pbVar7 < '!') {
                if ((*pbVar7 != 0x20) || ((char)pbVar9[2] < '!')) goto LAB_0011070f;
                pbVar7 = pbVar9 + 2;
              }
            }
          }
        }
        if (pbVar13 == pbVar7) goto switchD_0011040d_default;
        local_40 = 0;
        local_44 = 0;
        local_46 = 0;
        pbVar13 = pbVar7;
        if ((pbVar7 != (byte *)end) &&
           (pbVar13 = (byte *)flatcc_json_parser_integer(ctx,(char *)pbVar7,end,&local_44,&local_40)
           , pbVar13 != pbVar7)) {
          if (local_44 == 0) {
            uVar2 = local_40;
            if (local_40 < 0x8000) goto LAB_001107b8;
            iVar4 = 7;
          }
          else {
            if (local_40 < 0x8001) {
              uVar2 = -local_40;
LAB_001107b8:
              local_46 = (ushort)uVar2;
              goto LAB_001107bd;
            }
            iVar4 = 8;
          }
          pbVar13 = (byte *)flatcc_json_parser_set_error(ctx,(char *)pbVar13,end,iVar4);
        }
LAB_001107bd:
        if ((pbVar7 == pbVar13) &&
           ((pbVar13 = (byte *)flatcc_json_parser_symbolic_int16
                                         (ctx,(char *)pbVar13,end,
                                          MyGame_Example_Test_parse_json_struct_inline::
                                          symbolic_parsers_1,(int16_t *)&local_46),
            pbVar13 == pbVar7 || (pbVar13 == (byte *)end)))) {
LAB_00110820:
          pcVar3 = flatcc_json_parser_set_error(ctx,(char *)pbVar13,end,0x23);
          return pcVar3;
        }
        *(ushort *)struct_base = local_46;
      }
LAB_001107ef:
      pbVar13 = (byte *)flatcc_json_parser_object_end(ctx,(char *)pbVar13,end,&local_34);
    } while (local_34 != 0);
  }
  else {
    pbVar13 = pbVar7 + 1;
    if ((long)end - (long)pbVar13 < 2) {
LAB_00110847:
      pcVar3 = flatcc_json_parser_space_ext(ctx,(char *)pbVar13,end);
      return pcVar3;
    }
    if ((char)*pbVar13 < '!') {
      if ((*pbVar13 != 0x20) || ((char)pbVar7[2] < '!')) goto LAB_00110847;
      pbVar13 = pbVar7 + 2;
    }
  }
  return (char *)pbVar13;
}

Assistant:

static const char *MyGame_Example_Test_parse_json_struct_inline(flatcc_json_parser_t *ctx, const char *buf, const char *end, void *struct_base)
{
    int more;
    flatcc_builder_ref_t ref;
    void *pval;
    const char *mark;
    uint64_t w;

    buf = flatcc_json_parser_object_start(ctx, buf, end, &more);
    while (more) {
        buf = flatcc_json_parser_symbol_start(ctx, buf, end);
        w = flatcc_json_parser_symbol_part(buf, end);
        if ((w & 0xff00000000000000) == 0x6200000000000000) { /* "b" */
            buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 1);
            if (mark != buf) {
                int8_t val = 0;
                static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                        monster_test_local_MyGame_Example_json_parser_enum,
                        monster_test_global_json_parser_enum, 0 };
                pval = (void *)((size_t)struct_base + 2);
                buf = flatcc_json_parser_int8(ctx, (mark = buf), end, &val);
                if (mark == buf) {
                    buf = flatcc_json_parser_symbolic_int8(ctx, (mark = buf), end, symbolic_parsers, &val);
                    if (buf == mark || buf == end) goto failed;
                }
                flatbuffers_int8_write_to_pe(pval, val);
            } else {
                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
            }
        } else { /* "b" */
            if ((w & 0xff00000000000000) == 0x6100000000000000) { /* "a" */
                buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 1);
                if (mark != buf) {
                    int16_t val = 0;
                    static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                            monster_test_local_MyGame_Example_json_parser_enum,
                            monster_test_global_json_parser_enum, 0 };
                    pval = (void *)((size_t)struct_base + 0);
                    buf = flatcc_json_parser_int16(ctx, (mark = buf), end, &val);
                    if (mark == buf) {
                        buf = flatcc_json_parser_symbolic_int16(ctx, (mark = buf), end, symbolic_parsers, &val);
                        if (buf == mark || buf == end) goto failed;
                    }
                    flatbuffers_int16_write_to_pe(pval, val);
                } else {
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                }
            } else { /* "a" */
                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
            } /* "a" */
        } /* "b" */
        buf = flatcc_json_parser_object_end(ctx, buf, end , &more);
    }
    return buf;
failed:
    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
}